

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O1

void __thiscall QtMWidgets::PageView::PageView(PageView *this,QWidget *parent)

{
  QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
  *pQVar1;
  PageControl *pPVar2;
  QVariantAnimation *pQVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  PageViewPrivate *this_00;
  undefined4 *puVar8;
  undefined1 auVar9 [16];
  code *local_70;
  undefined8 local_68;
  code *local_60;
  ImplFn local_58;
  PageViewPrivate *local_50;
  QObject local_48 [8];
  QObject local_40 [8];
  QObject local_38 [8];
  
  QFrame::QFrame(&this->super_QFrame,parent,0);
  *(undefined ***)this = &PTR_metaObject_001932b0;
  *(undefined ***)&this->field_0x10 = &PTR__PageView_00193468;
  this_00 = (PageViewPrivate *)operator_new(0x60);
  PageViewPrivate::PageViewPrivate(this_00,this);
  pQVar1 = &this->d;
  pQVar1->d = this_00;
  pPVar2 = this_00->control;
  local_70 = PageControl::currentChanged;
  local_68._0_4_ = 0;
  local_68._4_4_ = 0;
  local_60 = _q_currentIndexChanged;
  local_58 = (ImplFn)0x0;
  puVar8 = (undefined4 *)operator_new(0x20);
  *puVar8 = 1;
  *(code **)(puVar8 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::PageView::*)(int,_int),_QtPrivate::List<int,_int>,_void>::impl;
  *(code **)(puVar8 + 4) = _q_currentIndexChanged;
  *(undefined8 *)(puVar8 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)pPVar2,(QObject *)&local_70,(void **)this,
             (QSlotObjectBase *)&local_60,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pQVar3 = pQVar1->d->normalizeAnimation;
  local_70 = QVariantAnimation::valueChanged;
  local_68._0_4_ = 0;
  local_68._4_4_ = 0;
  local_60 = _q_normalizePageAnimation;
  local_58 = (ImplFn)0x0;
  puVar8 = (undefined4 *)operator_new(0x20);
  *puVar8 = 1;
  *(code **)(puVar8 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::PageView::*)(const_QVariant_&),_QtPrivate::List<const_QVariant_&>,_void>
       ::impl;
  *(code **)(puVar8 + 4) = _q_normalizePageAnimation;
  *(undefined8 *)(puVar8 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pQVar3,(QObject *)&local_70,(void **)this,
             (QSlotObjectBase *)&local_60,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pQVar3 = pQVar1->d->normalizeAnimation;
  local_70 = QAbstractAnimation::finished;
  local_68._0_4_ = 0;
  local_68._4_4_ = 0;
  local_60 = _q_normalizeAnimationFinished;
  local_58 = (ImplFn)0x0;
  puVar8 = (undefined4 *)operator_new(0x20);
  *puVar8 = 1;
  *(code **)(puVar8 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::PageView::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar8 + 4) = _q_normalizeAnimationFinished;
  *(undefined8 *)(puVar8 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pQVar3,(QObject *)&local_70,(void **)this,
             (QSlotObjectBase *)&local_60,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  local_50 = (this->d).d;
  auVar9 = QFrame::frameRect();
  iVar4 = QFrame::frameWidth();
  iVar5 = QFrame::frameWidth();
  iVar6 = QFrame::frameWidth();
  iVar7 = QFrame::frameWidth();
  local_70._0_4_ = iVar4 + auVar9._0_4_;
  local_68._0_4_ = auVar9._8_4_ - iVar6;
  local_70._4_4_ = iVar5 + auVar9._4_4_;
  local_68._4_4_ = auVar9._12_4_ - iVar7;
  PageViewPrivate::relayoutChildren(local_50,(QRect *)&local_70);
  QWidget::raise();
  QWidget::show();
  return;
}

Assistant:

PageView::PageView( QWidget * parent )
	:	QFrame( parent )
	,	d( new PageViewPrivate( this ) )
{
	connect( d->control, &PageControl::currentChanged,
		this, &PageView::_q_currentIndexChanged );

	connect( d->normalizeAnimation, &QVariantAnimation::valueChanged,
		this, &PageView::_q_normalizePageAnimation );

	connect( d->normalizeAnimation, &QVariantAnimation::finished,
		this, &PageView::_q_normalizeAnimationFinished );

	d->relayoutChildren( frameRect().adjusted( frameWidth(), frameWidth(),
		-frameWidth(), -frameWidth() ) );

	d->control->raise();

	d->control->show();
}